

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

bool argparse::Argument::is_positional(string_view name,string_view prefix_chars)

{
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  char *extraout_RDX;
  Argument *this;
  string_view s;
  
  if (name._M_len == 0) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = (uint)(byte)*name._M_str;
  }
  if (prefix_chars._M_len != 0 && uVar2 != 0xffffffff) {
    pvVar3 = memchr(prefix_chars._M_str,(int)(char)uVar2,prefix_chars._M_len);
    if (((long)pvVar3 - (long)prefix_chars._M_str != -1 && pvVar3 != (void *)0x0) &&
       (this = (Argument *)(name._M_len - 1), this != (Argument *)0x0)) {
      s._M_str = extraout_RDX;
      s._M_len = (size_t)(name._M_str + 1);
      bVar1 = is_decimal_literal(this,s);
      return bVar1;
    }
  }
  return true;
}

Assistant:

static bool is_positional(std::string_view name,
                            std::string_view prefix_chars) {
    auto first = lookahead(name);

    if (first == eof) {
      return true;
    } else if (prefix_chars.find(static_cast<char>(first)) !=
               std::string_view::npos) {
      name.remove_prefix(1);
      if (name.empty()) {
        return true;
      }
      return is_decimal_literal(name);
    }
    return true;
  }